

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O3

void recursive_encode(attr_list l,AttrBuffer b,attr_value_type t)

{
  byte bVar1;
  int_attr_struct *piVar2;
  attr_p paVar3;
  void *__dest;
  undefined8 *puVar4;
  size_t sVar5;
  undefined2 *puVar6;
  undefined4 *puVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  char *pcVar11;
  
  if (l->list_of_lists == 0) {
    piVar2 = (l->l).list.iattrs;
    if (t == Attr_Int4) {
      bVar1 = piVar2->int_attr_count;
      if (bVar1 != 0) {
        __dest = add_to_tmp_buffer(b,(uint)bVar1 << 3);
        memcpy(__dest,((l->l).list.iattrs)->iattr,(ulong)bVar1 << 3);
        pcVar11 = (char *)((long)b->tmp_buffer + 1);
        *pcVar11 = *pcVar11 + bVar1;
      }
    }
    else if (piVar2->other_attr_count != '\0') {
      lVar9 = 0x10;
      uVar8 = 0;
      do {
        paVar3 = (l->l).list.attributes;
        puVar4 = (undefined8 *)add_to_tmp_buffer(b,8);
        *puVar4 = *(undefined8 *)((long)paVar3 + lVar9 + -0x10);
        switch(*(undefined4 *)((long)paVar3 + lVar9 + -0xc)) {
        case 0:
        case 1:
        case 7:
        case 9:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                        ,0x6a0,"void recursive_encode(attr_list, AttrBuffer, attr_value_type)");
        case 2:
        case 8:
          puVar4 = (undefined8 *)add_to_tmp_buffer(b,8);
          *puVar4 = *(undefined8 *)((long)paVar3 + lVar9 + -8);
          break;
        case 3:
          pcVar11 = *(char **)((long)paVar3 + lVar9 + -8);
          sVar5 = strlen(pcVar11);
          iVar10 = (int)sVar5 + 1;
          goto LAB_00105f66;
        case 4:
          pcVar11 = *(char **)((long)&paVar3->attr_id + lVar9);
          iVar10 = *(int *)((long)paVar3 + lVar9 + -8);
LAB_00105f66:
          puVar6 = (undefined2 *)add_to_tmp_buffer(b,iVar10 + 5U & 0xfffffffc);
          *puVar6 = (short)iVar10;
          memcpy(puVar6 + 1,pcVar11,(long)iVar10);
          break;
        case 5:
          puVar7 = (undefined4 *)add_to_tmp_buffer(b,4);
          *puVar7 = *(undefined4 *)((long)paVar3 + lVar9 + -8);
          break;
        case 6:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                        ,0x6c1,"void recursive_encode(attr_list, AttrBuffer, attr_value_type)");
        }
        pcVar11 = (char *)((long)b->tmp_buffer + 2);
        *pcVar11 = *pcVar11 + '\x01';
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 0x18;
      } while (uVar8 < ((l->l).list.iattrs)->other_attr_count);
    }
  }
  else if (0 < (l->l).lists.sublist_count) {
    iVar10 = 0;
    do {
      recursive_encode(l,b,t);
      iVar10 = iVar10 + 1;
    } while (iVar10 < (l->l).lists.sublist_count);
  }
  return;
}

Assistant:

static void
recursive_encode(attr_list l, AttrBuffer b, attr_value_type t)
{
    if (l->list_of_lists == 0) {
	switch (t) {
	case Attr_Int4: {
	    /* marshalling only int4 attributes in this pass */
	    int attr_count = l->l.list.iattrs->int_attr_count;
	    void *buffer_end;
	    if (attr_count == 0) return;
	    buffer_end = add_to_tmp_buffer(b, (unsigned)(attr_count * 
					   sizeof(int_attr)));
	    memcpy(buffer_end, &l->l.list.iattrs->iattr[0], 
		   attr_count * sizeof(int_attr));
	    ((int_attr_p) b->tmp_buffer)->int_attr_count += attr_count;
	    break;
	  }
	default: {
	    /* no bulk stuff here... marshal one by one */
	    int i;
	    for (i=0; i<l->l.list.iattrs->other_attr_count; i++) {
		attr_p attr = &l->l.list.attributes[i];
		void *buffer_end = add_to_tmp_buffer(b, 8);
		memcpy(buffer_end, attr, 8);
		switch (attr->val_type) {
		case Attr_Int4:
		case Attr_Undefined:
		case Attr_Float16:
		case Attr_Float4:
		    assert(0);
		    break;
		case Attr_Atom:
		    buffer_end = add_to_tmp_buffer(b, 4);
		    *((int*)buffer_end) = (int) (long)attr->value.u.i;
		    break;
		case Attr_Int8:
		    buffer_end = add_to_tmp_buffer(b, 8);
		    memcpy(buffer_end, &attr->value.u.l, 8);
		    break;
		case Attr_Float8:
		    buffer_end = add_to_tmp_buffer(b, 8);
		    memcpy(buffer_end, &attr->value, 8);
		    break;
		case Attr_Opaque:
		case Attr_String: {
		    void *value;
		    int len;
		    int pad_len;
		    if (attr->val_type == Attr_String) {
			value = (char*) attr->value.u.p;
			len = (int)strlen((char*)value) + 1;
		    } else {
			value = attr->value.u.o.buffer;
			len = attr->value.u.o.length;
		    }
		    pad_len = roundup4(len+2) - 2;
		    buffer_end = add_to_tmp_buffer(b, 2 + pad_len);
		    *((int2*)buffer_end) = (int2) len;
		    memcpy((char*)buffer_end + 2, value, len);
		    break;
		  }
		case Attr_List:
		    assert(0);
		    break;
		}
		((int_attr_p) b->tmp_buffer)->other_attr_count ++;
	    }
	  }
	}
    } else {
        int i;
        for (i=0; i<l->l.lists.sublist_count; i++) {
	    recursive_encode(l, b, t);
	}
    }
}